

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Key.cpp
# Opt level: O0

void MiniScript::KeyPutString(String *s,bool inFront)

{
  long lVar1;
  uchar *puVar2;
  unsigned_long uVar3;
  undefined1 local_58 [8];
  String character_1;
  InputBufferEntry e_1;
  int i_1;
  undefined1 local_30 [8];
  String character;
  InputBufferEntry e;
  int i;
  bool inFront_local;
  String *s_local;
  
  if (inFront) {
    lVar1 = String::Length(s);
    e.c = (wchar_t)lVar1;
    while (e.c = e.c + L'\xffffffff', L'\xffffffff' < e.c) {
      character.isTemp = false;
      character._9_7_ = 0;
      String::Substring((String *)local_30,(long)s,(long)e.c);
      puVar2 = (uchar *)String::c_str((String *)local_30);
      uVar3 = UTF8Decode(puVar2);
      character._8_4_ = (int)uVar3;
      SimpleVector<MiniScript::InputBufferEntry>::insert
                ((SimpleVector<MiniScript::InputBufferEntry> *)inputBuffer,
                 (InputBufferEntry *)&character.isTemp,0);
      String::~String((String *)local_30);
    }
  }
  else {
    for (e_1.c = L'\0'; lVar1 = String::Length(s), e_1.c < lVar1; e_1.c = e_1.c + L'\x01') {
      character_1.isTemp = false;
      character_1._9_7_ = 0;
      String::Substring((String *)local_58,(long)s,(long)e_1.c);
      puVar2 = (uchar *)String::c_str((String *)local_58);
      uVar3 = UTF8Decode(puVar2);
      character_1._8_4_ = (int)uVar3;
      SimpleVector<MiniScript::InputBufferEntry>::push_back
                ((SimpleVector<MiniScript::InputBufferEntry> *)inputBuffer,
                 (InputBufferEntry *)&character_1.isTemp);
      String::~String((String *)local_58);
    }
  }
  return;
}

Assistant:

void KeyPutString(String s, bool inFront) {
	if (inFront) {
		for (int i=s.Length()-1; i>=0; i--) {
			struct InputBufferEntry e = {0, 0};
			String character = s.Substring(i, 1);
			e.c = UTF8Decode((unsigned char *)character.c_str());
			inputBuffer.insert(e, 0);
		}
	} else {
		for (int i=0; i<s.Length(); i++) {
			struct InputBufferEntry e = {0, 0};
			String character = s.Substring(i, 1);
			e.c = UTF8Decode((unsigned char *)character.c_str());
			inputBuffer.push_back(e);
		}
	}
}